

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall mpt::logfile::~logfile(logfile *this)

{
  logfile *this_local;
  
  if ((((this->file != (FILE *)0x0) && (this->file != _stdin)) && (this->file != _stdout)) &&
     (this->file != _stderr)) {
    fclose((FILE *)this->file);
  }
  return;
}

Assistant:

logfile::~logfile()
{
	if (!file
	 || file == stdin
	 || file == stdout
	 || file == stderr) {
		return;
	}
	fclose(file);
}